

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O1

bool cmExportCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  pointer pbVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  cmExecutionStatus *pcVar4;
  undefined1 this [8];
  bool bVar5;
  bool bVar6;
  int iVar7;
  TargetType TVar8;
  PolicyStatus PVar9;
  undefined8 *puVar10;
  cmGlobalGenerator *pcVar11;
  long *plVar12;
  PackageDependency *pPVar13;
  ostream *poVar14;
  string *psVar15;
  cmTarget *this_00;
  cmExportBuildFileGenerator *pcVar16;
  iterator iVar17;
  size_t sVar18;
  PackageDependencyExportEnabled PVar19;
  offset_in_Arguments_to_bool member;
  long *plVar20;
  PolicyID id;
  char *pcVar21;
  char *extraout_RDX;
  string *ct;
  undefined1 config [8];
  size_t sVar22;
  pointer pTVar23;
  undefined8 uVar24;
  _Rb_tree_header *p_Var25;
  ulong uVar26;
  _Base_ptr name;
  cmExportSet *exportSet;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  static_string_view name_06;
  static_string_view name_07;
  static_string_view name_08;
  static_string_view name_09;
  static_string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view value;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view name_13;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view value_00;
  string_view input;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  targets;
  PackageDependencyArguments packageDependencyArguments;
  string fname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  string package;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  cmCryptoHash hasher;
  cmArgumentParser<Arguments> parser;
  Arguments arguments;
  undefined1 auStack_738 [8];
  cmExecutionStatus *local_730;
  _Any_data local_728;
  _func_int *local_718;
  code *pcStack_710;
  cmGlobalGenerator *local_700;
  _Any_data local_6f8;
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [24];
  _Alloc_hider _Stack_6c0;
  pointer local_6b8;
  pointer pbStack_6b0;
  pointer local_6a8;
  undefined1 auStack_6a0 [24];
  undefined1 local_688 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_670;
  _Alloc_hider _Stack_660;
  pointer local_658;
  undefined1 auStack_650 [24];
  _Manager_type local_638;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_630;
  _Alloc_hider _Stack_620;
  cmExportSet *local_618;
  undefined1 local_610 [8];
  undefined1 local_608 [48];
  undefined1 local_5d8 [8];
  undefined1 local_5d0 [24];
  _Base_ptr local_5b8;
  _Base_ptr local_5b0;
  undefined1 local_5a8 [16];
  undefined1 local_598 [8];
  cmExportBuildFileGenerator *pcStack_590;
  undefined1 local_588 [48];
  cmLocalGenerator *local_558;
  _Alloc_hider _Stack_550;
  pointer local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_540;
  undefined1 auStack_530 [520];
  cmCryptoHash local_328;
  undefined1 local_318 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  _Manager_type local_2f0;
  pointer local_2e8;
  _Any_data local_2e0;
  _Alloc_hider local_2d0;
  _Base_ptr local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  _Alloc_hider local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  _Base_ptr local_240;
  _Base_ptr local_238;
  char local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  pointer local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  string local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  cmExportSet *local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  pointer local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  undefined2 local_1a0;
  cmGlobalGenerator *local_198;
  undefined1 local_190;
  undefined7 uStack_18f;
  undefined1 uStack_188;
  undefined8 uStack_187;
  cmGlobalGenerator *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_170 [18];
  undefined8 local_50;
  void *local_40;
  undefined4 local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_730 = status;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    local_598 = (undefined1  [8])local_588;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_5a8 + 0x10),"called with too few arguments","");
    std::__cxx11::string::_M_assign((string *)&local_730->Error);
    if (local_598 != (undefined1  [8])local_588) {
      operator_delete((void *)local_598,local_588._0_8_ + 1);
    }
    return false;
  }
  iVar7 = std::__cxx11::string::compare((char *)pbVar1);
  if (iVar7 == 0) {
    local_5b0 = (_Base_ptr)0x0;
    local_5a8[0] = '\0';
    local_5b8 = (_Base_ptr)local_5a8;
    if (0x20 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      uVar26 = 1;
      do {
        if (uVar26 == 2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_5a8 + 0x10));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_5a8 + 0x10),"PACKAGE given unknown argument: ",0x20);
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_5a8 + 0x10),pbVar1[2]._M_dataplus._M_p,
                     pbVar1[2]._M_string_length);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::_M_assign((string *)&local_730->Error);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_allocated_capacity != &local_250) {
            operator_delete((void *)local_260._M_allocated_capacity,
                            CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0]
                                    ) + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_5a8 + 0x10));
          std::ios_base::~ios_base((ios_base *)(auStack_530 + 8));
          goto LAB_003b2aa6;
        }
        std::__cxx11::string::_M_assign((string *)(local_5d0 + 0x18));
        uVar26 = uVar26 + 1;
      } while (uVar26 < (ulong)((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if (local_5b0 == (_Base_ptr)0x0) {
      local_260._M_allocated_capacity = 0x25;
      local_598 = (undefined1  [8])local_588;
      local_598 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)(local_5a8 + 0x10),(ulong)&local_260);
      local_588._0_8_ = local_260._M_allocated_capacity;
      ((_Base_ptr)local_598)->_M_left = (_Base_ptr)0x2061206e65766967;
      ((_Base_ptr)local_598)->_M_right = (_Base_ptr)0x206567616b636170;
      *(undefined8 *)&((_Base_ptr)local_598)->_M_color = 0x204547414b434150;
      ((_Base_ptr)local_598)->_M_parent = (_Base_ptr)0x206562207473756d;
      *(undefined8 *)((long)&((_Base_ptr)local_598)->_M_right + 5) = 0x2e656d616e206567;
      pcStack_590 = (cmExportBuildFileGenerator *)local_260._M_allocated_capacity;
      *(char *)((long)&((_Base_ptr)local_598)->_M_color + local_260._M_allocated_capacity) = '\0';
      std::__cxx11::string::_M_assign((string *)&local_730->Error);
      if (local_598 != (undefined1  [8])local_588) {
        operator_delete((void *)local_598,local_588._0_8_ + 1);
      }
LAB_003b2aa6:
      bVar6 = false;
      goto LAB_003b41ab;
    }
    local_50 = 0;
    local_40 = (void *)0x0;
    local_38 = 0;
    memset(&local_260,0,0x20a);
    cmsys::RegularExpression::compile((RegularExpression *)&local_260,"^[A-Za-z0-9_.-]+$");
    bVar6 = cmsys::RegularExpression::find
                      ((RegularExpression *)&local_260,(char *)local_5b8,
                       (RegularExpressionMatch *)&local_260);
    if (bVar6) {
      pcVar2 = local_730->Makefile;
      PVar9 = cmMakefile::GetPolicyStatus(pcVar2,CMP0090,false);
      if (PVar9 - NEW < 3) {
        local_318._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1d;
        local_598 = (undefined1  [8])local_588;
        local_598 = (undefined1  [8])
                    std::__cxx11::string::_M_create((ulong *)(local_5a8 + 0x10),(ulong)local_318);
        local_588._0_8_ = local_318._0_8_;
        *(undefined8 *)((long)&((_Base_ptr)local_598)->_M_parent + 5) = 0x5f4547414b434150;
        *(undefined8 *)((long)&((_Base_ptr)local_598)->_M_left + 5) = 0x5952545349474552;
        *(undefined8 *)&((_Base_ptr)local_598)->_M_color = 0x58455f454b414d43;
        ((_Base_ptr)local_598)->_M_parent = (_Base_ptr)0x4341505f54524f50;
        pcStack_590 = (cmExportBuildFileGenerator *)local_318._0_8_;
        *(char *)((long)&((_Base_ptr)local_598)->_M_color + local_318._0_8_) = '\0';
        bVar5 = cmMakefile::IsOn(pcVar2,(string *)(local_5a8 + 0x10));
        if (local_598 != (undefined1  [8])local_588) {
          operator_delete((void *)local_598,local_588._0_8_ + 1);
        }
        if (!bVar5) goto LAB_003b4199;
      }
      else if (PVar9 < NEW) {
        local_598 = (undefined1  [8])local_588;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_5a8 + 0x10),"CMAKE_EXPORT_NO_PACKAGE_REGISTRY","");
        bVar5 = cmMakefile::IsOn(pcVar2,(string *)(local_5a8 + 0x10));
        if (local_598 != (undefined1  [8])local_588) {
          operator_delete((void *)local_598,local_588._0_8_ + 1);
        }
        if (bVar5) goto LAB_003b4199;
      }
      psVar15 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar2);
      cmCryptoHash::cmCryptoHash(&local_328,AlgoMD5);
      input._M_str = (psVar15->_M_dataplus)._M_p;
      input._M_len = psVar15->_M_string_length;
      cmCryptoHash::HashString_abi_cxx11_((string *)&local_2a0,&local_328,input);
      pcVar21 = (psVar15->_M_dataplus)._M_p;
      local_728._8_8_ = 0.0;
      local_718 = (_func_int *)((ulong)local_718 & 0xffffffffffffff00);
      local_728._M_unused._M_object = &local_718;
      bVar5 = cmsys::SystemTools::GetEnv("HOME",(string *)&local_728);
      if (bVar5) {
        cmsys::SystemTools::ConvertToUnixSlashes((string *)&local_728);
        std::__cxx11::string::append(local_728._M_pod_data);
        std::__cxx11::string::_M_append(local_728._M_pod_data,(ulong)local_5b8);
        cmsys::SystemTools::MakeDirectory((string *)&local_728,(mode_t *)0x0);
        std::__cxx11::string::append(local_728._M_pod_data);
        std::__cxx11::string::append(local_728._M_pod_data);
        bVar5 = cmsys::SystemTools::FileExists((string *)&local_728);
        if (!bVar5) {
          cmGeneratedFileStream::cmGeneratedFileStream
                    ((cmGeneratedFileStream *)(local_5a8 + 0x10),(string *)&local_728,true,None);
          if ((*(uint *)(local_588 +
                        (long)&((_Base_ptr)((long)local_598 + -0x20))->_M_parent->_M_left) & 5) == 0
             ) {
            if (pcVar21 == (char *)0x0) {
              std::ios::clear((int)(auStack_738 +
                                   (long)((_Base_ptr)((long)local_598 + -0x20))->_M_parent) + 0x1a0)
              ;
            }
            else {
              sVar18 = strlen(pcVar21);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_5a8 + 0x10),pcVar21,sVar18);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_5a8 + 0x10),"\n",1)
            ;
          }
          else {
            cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
            local_318._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x27;
            local_318._8_8_ = "Cannot create package registry file:\n  ";
            local_318._16_8_ = (pointer)0x0;
            local_300._M_allocated_capacity = local_728._8_8_;
            local_300._8_8_ = local_728._M_unused._M_object;
            local_2f0 = (_Manager_type)0x0;
            local_688._16_8_ = &aStack_670;
            local_688._0_8_ = (char *)0x0;
            local_688._8_8_ = &DAT_00000001;
            aStack_670._M_local_buf[0] = 10;
            local_2e8 = (pointer)&DAT_00000001;
            local_2e0._8_8_ = (pointer)0x0;
            local_2d0._M_p = (pointer)local_608._8_8_;
            local_2c8 = (_Base_ptr)local_608._0_8_;
            local_6e8._0_8_ = local_6e8 + 8;
            local_6f8._M_unused._M_object = (cmExportBuildFileGenerator *)0x0;
            local_6f8._8_8_ = &DAT_00000001;
            local_6e8[8] = 10;
            local_2c0._8_8_ = 1;
            local_2a8 = 0;
            views_00._M_len = 5;
            views_00._M_array = (iterator)local_318;
            local_2e0._M_unused._0_8_ = (undefined8)local_688._16_8_;
            local_2c0._M_allocated_capacity = (size_type)local_608;
            local_2b0._M_p = (pointer)local_6e8._0_8_;
            cmCatViews((string *)(local_608 + 0x28),views_00);
            cmMakefile::IssueMessage(pcVar2,WARNING,(string *)(local_608 + 0x28));
            if ((pointer)local_608._40_8_ != (pointer)(local_5d8 + 8)) {
              operator_delete((void *)local_608._40_8_,local_5d0._0_8_ + 1);
            }
            if ((_Base_ptr)local_608._0_8_ != (_Base_ptr)(local_608 + 0x10)) {
              operator_delete((void *)local_608._0_8_,(ulong)(local_608._16_8_ + 1));
            }
          }
          cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)(local_5a8 + 0x10))
          ;
        }
      }
      if ((_func_int **)local_728._M_unused._0_8_ != &local_718) {
        operator_delete(local_728._M_unused._M_object,(ulong)(local_718 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_allocated_capacity != &local_290) {
        operator_delete((void *)local_2a0._M_allocated_capacity,
                        (ulong)(local_290._M_allocated_capacity + 1));
      }
      cmCryptoHash::~cmCryptoHash(&local_328);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_5a8 + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_5a8 + 0x10),"PACKAGE given invalid package name \"",0x24);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_5a8 + 0x10),(char *)local_5b8,(long)local_5b0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\".  ",4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"Package names must match \"",0x1a)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"^[A-Za-z0-9_.-]+$",0x11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\".",2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&local_730->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_318 + 0x10)) {
        operator_delete((void *)local_318._0_8_,
                        (ulong)((long)&((basic_string_view<char,_std::char_traits<char>_> *)
                                       local_318._16_8_)->_M_len + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_5a8 + 0x10));
      std::ios_base::~ios_base((ios_base *)(auStack_530 + 8));
    }
LAB_003b4199:
    if (local_40 != (void *)0x0) {
      operator_delete__(local_40);
    }
LAB_003b41ab:
    if (local_5b8 == (_Base_ptr)local_5a8) {
      return bVar6;
    }
    operator_delete(local_5b8,CONCAT71(local_5a8._1_7_,local_5a8[0]) + 1);
    return bVar6;
  }
  aStack_540._8_8_ = 0;
  auStack_530._0_8_ = 0;
  local_548 = (pointer)0x0;
  aStack_540._M_allocated_capacity = 0;
  local_558 = (cmLocalGenerator *)0x0;
  _Stack_550._M_p = (pointer)0x0;
  local_588._32_8_ = 0;
  local_588._40_8_ = (pointer)0x0;
  local_588._16_8_ = (cmExportSet *)0x0;
  local_588._24_8_ = (code *)0x0;
  local_588._0_8_ = (pointer)0x0;
  local_588._8_8_ = (code *)0x0;
  local_598 = (undefined1  [8])0x0;
  pcStack_590 = (cmExportBuildFileGenerator *)0x0;
  name_00.super_string_view._M_str = "NAMESPACE";
  name_00.super_string_view._M_len = 9;
  cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)(local_5a8 + 0x10),name_00,0x40);
  name_01.super_string_view._M_str = "FILE";
  name_01.super_string_view._M_len = 4;
  cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)(local_5a8 + 0x10),name_01,0x60);
  name_02.super_string_view._M_str = "CXX_MODULES_DIRECTORY";
  name_02.super_string_view._M_len = 0x15;
  cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Bind<std::__cxx11::string>
            ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)(local_5a8 + 0x10),name_02,0xa0);
  ArgumentParser::ActionMap::ActionMap((ActionMap *)local_318,(ActionMap *)(local_5a8 + 0x10));
  std::
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
             *)&aStack_540);
  if ((pointer)_Stack_550._M_p != (pointer)0x0) {
    (*(code *)_Stack_550._M_p)(local_588 + 0x28,local_588 + 0x28,3);
  }
  if ((code *)local_588._24_8_ != (code *)0x0) {
    (*(code *)local_588._24_8_)(local_588 + 8,local_588 + 8,3);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             *)(local_5a8 + 0x10));
  iVar7 = std::__cxx11::string::compare
                    ((char *)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  if (iVar7 == 0) {
    name_06.super_string_view._M_str = "EXPORT";
    name_06.super_string_view._M_len = 6;
    cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
    ::Bind<std::__cxx11::string>
              ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                *)local_318,name_06,0);
    bVar6 = cmExperimental::HasSupportEnabled(local_730->Makefile,ExportPackageDependencies);
    if (bVar6) {
      member = 0xe0;
      pcVar21 = "EXPORT_PACKAGE_DEPENDENCIES";
      sVar22 = 0x1b;
      goto LAB_003b25b9;
    }
  }
  else {
    iVar7 = std::__cxx11::string::compare
                      ((char *)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar7 == 0) {
      name_08.super_string_view._M_str = "SETUP";
      name_08.super_string_view._M_len = 5;
      cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)local_318,name_08,0);
      bVar6 = cmExperimental::HasSupportEnabled(local_730->Makefile,ExportPackageDependencies);
      if (bVar6) {
        name_09.super_string_view._M_str = "PACKAGE_DEPENDENCY";
        name_09.super_string_view._M_len = 0x12;
        cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
        ::
        Bind<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                  ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                    *)local_318,name_09,200);
      }
      name_10.super_string_view._M_str = "TARGET";
      name_10.super_string_view._M_len = 6;
      cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::
      Bind<std::vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)local_318,name_10,0xe8);
    }
    else {
      pcStack_590 = (cmExportBuildFileGenerator *)0x0;
      local_598 = (undefined1  [8])0x20;
      local_588._8_8_ =
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
           ::_M_invoke;
      local_588._0_8_ =
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
           ::_M_manager;
      name_03._M_str = "TARGETS";
      name_03._M_len = 7;
      ArgumentParser::Base::Bind((Base *)local_318,name_03,(KeywordAction *)(local_5a8 + 0x10));
      if ((pointer)local_588._0_8_ != (pointer)0x0) {
        (*(code *)local_588._0_8_)(local_5a8 + 0x10,local_5a8 + 0x10,3);
      }
      name_04.super_string_view._M_str = "ANDROID_MK";
      name_04.super_string_view._M_len = 10;
      cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<cmExportCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)local_318,name_04,0x80);
      name_05.super_string_view._M_str = "APPEND";
      name_05.super_string_view._M_len = 6;
      cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)local_318,name_05,0xc0)
      ;
      member = 0xc1;
      pcVar21 = "EXPORT_LINK_INTERFACE_LIBRARIES";
      sVar22 = 0x1f;
LAB_003b25b9:
      name_07.super_string_view._M_str = pcVar21;
      name_07.super_string_view._M_len = sVar22;
      cmArgumentParser<Arguments>::Bind<bool>
                ((cmArgumentParser<Arguments> *)local_318,name_07,member);
    }
  }
  local_588._0_8_ = local_608;
  local_608._0_8_ = (_Base_ptr)0x0;
  local_608._8_8_ = (_Base_ptr)0x0;
  local_608._16_8_ = (void *)0x0;
  local_260._M_allocated_capacity = (size_type)&local_250;
  local_260._8_8_ = 0;
  local_250._M_local_buf[0] = false;
  local_228 = '\0';
  local_220 = &local_210;
  local_218 = (pointer)0x0;
  local_210._M_local_buf[0] = '\0';
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  local_200._M_string_length = 0;
  local_200.field_2._M_local_buf[0] = '\0';
  local_1e0 = &local_1d0;
  local_1d8 = (cmExportSet *)0x0;
  local_1d0._M_local_buf[0] = '\0';
  local_1c0 = &local_1b0;
  local_1b8 = (pointer)0x0;
  local_1b0._M_local_buf[0] = '\0';
  local_1a0 = 0;
  local_178 = (cmGlobalGenerator *)0x0;
  aaStack_170[0]._M_allocated_capacity = (cmGlobalGenerator *)0x0;
  aaStack_170[0]._8_8_ = 0;
  uStack_188 = 0;
  uStack_187 = 0;
  local_198 = (cmGlobalGenerator *)0x0;
  local_190 = 0;
  uStack_18f = 0;
  pcStack_590 = (cmExportBuildFileGenerator *)0x0;
  local_588._8_8_ = &local_260;
  local_588._16_8_ = (cmExportSet *)0x0;
  local_588._24_8_ = (code *)0x0;
  local_588._32_8_ = 0;
  local_588._40_8_ = (pointer)0x0;
  local_558 = (cmLocalGenerator *)0x0;
  _Stack_550._M_p = (pointer)0x0;
  local_548 = (pointer)0x0;
  aStack_540._M_allocated_capacity = 0;
  aStack_540._8_8_ = aStack_540._8_8_ & 0xffffffffffffff00;
  local_598 = (undefined1  [8])local_318;
  ArgumentParser::Instance::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Instance *)(local_5a8 + 0x10),args,0);
  if (local_548 != (pointer)0x0) {
    (*(code *)local_548)(&local_558,&local_558,3);
  }
  if (local_608._0_8_ != local_608._8_8_) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688,
                   "Unknown argument: \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_608._0_8_);
    puVar10 = (undefined8 *)std::__cxx11::string::append(local_688);
    pcVar16 = (cmExportBuildFileGenerator *)(puVar10 + 2);
    if ((cmExportBuildFileGenerator *)*puVar10 == pcVar16) {
      local_588._0_8_ =
           (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              *)&(pcVar16->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_588._8_8_ = puVar10[3];
      local_598 = (undefined1  [8])local_588;
    }
    else {
      local_588._0_8_ =
           (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
              *)&(pcVar16->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_598 = (undefined1  [8])*puVar10;
    }
    pcStack_590 = (cmExportBuildFileGenerator *)puVar10[1];
    *puVar10 = pcVar16;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    std::__cxx11::string::_M_assign((string *)&local_730->Error);
    if (local_598 != (undefined1  [8])local_588) {
      operator_delete((void *)local_598,
                      (ulong)((long)&(((string *)local_588._0_8_)->_M_dataplus)._M_p + 1));
    }
    if ((undefined1 *)local_688._0_8_ != local_688 + 0x10) {
      operator_delete((void *)local_688._0_8_,(ulong)(local_688._16_8_ + 1));
    }
    bVar6 = false;
    goto LAB_003b28e5;
  }
  iVar7 = std::__cxx11::string::compare
                    ((char *)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  if (iVar7 == 0) {
    pcVar11 = cmMakefile::GetGlobalGenerator(local_730->Makefile);
    local_618 = cmExportSetMap::operator[](&pcVar11->ExportSets,(string *)&local_260);
    aStack_630._8_8_ = (pointer)0x0;
    _Stack_620._M_p = (pointer)0x0;
    local_638 = (_Manager_type)0x0;
    aStack_630._M_allocated_capacity = 0;
    auStack_650._8_8_ = 0;
    auStack_650._16_8_ = (_Manager_type)0x0;
    local_658 = (pointer)0x0;
    auStack_650._0_8_ = (char *)0x0;
    aStack_670._8_8_ = (cmExportBuildFileGenerator *)0x0;
    _Stack_660._M_p = (pointer)0x0;
    local_688._16_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    aStack_670._0_8_ = (_Any_data *)0x0;
    local_688._0_8_ = (char *)0x0;
    local_688._8_8_ = (pointer)0x0;
    local_6f8._M_unused._M_object = (void *)0x0;
    local_6f8._8_8_ = 0;
    local_6e8._8_8_ =
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
         ::_M_invoke;
    local_6e8._0_8_ =
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
         ::_M_manager;
    name_11._M_str = "ENABLED";
    name_11._M_len = 7;
    ArgumentParser::Base::Bind((Base *)local_688,name_11,(KeywordAction *)&local_6f8);
    if ((_func_int **)local_6e8._0_8_ != (_func_int **)0x0) {
      (*(code *)local_6e8._0_8_)(&local_6f8,&local_6f8,3);
    }
    local_6f8._8_8_ = (_Any_data *)0x0;
    local_6f8._M_unused._M_member_pointer = 0x20;
    local_6e8._8_8_ =
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
         ::_M_invoke;
    local_6e8._0_8_ =
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
         ::_M_manager;
    name_12._M_str = "EXTRA_ARGS";
    name_12._M_len = 10;
    ArgumentParser::Base::Bind((Base *)local_688,name_12,(KeywordAction *)&local_6f8);
    if ((pointer)local_6e8._0_8_ != (pointer)0x0) {
      (*(code *)local_6e8._0_8_)(&local_6f8,&local_6f8,3);
    }
    ArgumentParser::ActionMap::ActionMap((ActionMap *)(local_5a8 + 0x10),(ActionMap *)local_688);
    std::
    vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
               *)&aStack_630);
    if ((_Manager_type)auStack_650._16_8_ != (_Manager_type)0x0) {
      (*(code *)auStack_650._16_8_)(auStack_650,auStack_650,3);
    }
    if ((_Manager_type)_Stack_660._M_p != (_Manager_type)0x0) {
      (*(code *)_Stack_660._M_p)(&aStack_670,&aStack_670,3);
    }
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               *)local_688);
    local_700 = (cmGlobalGenerator *)CONCAT71(uStack_18f,local_190);
    if (local_198 != local_700) {
      local_5d0._16_8_ = &local_730->Error;
      pcVar11 = local_198;
      do {
        iVar7 = 3;
        if (pcVar11->_vptr_cmGlobalGenerator != (_func_int **)(pcVar11->TryCompileTimeout).__r) {
          local_728._8_8_ = (pcVar11->TryCompileTimeout).__r;
          local_728._M_unused._M_object = pcVar11->_vptr_cmGlobalGenerator + 4;
          local_6f8._M_unused._M_object = local_6e8;
          local_6f8._8_8_ = (_Any_data *)0x0;
          local_6e8._0_8_ = local_6e8._0_8_ & 0xffffffffffffff00;
          local_6d8._16_8_ = 0;
          local_6d8._0_8_ = (pointer)0x0;
          local_6d8._8_8_ = (code *)0x0;
          local_688._0_8_ = local_5a8 + 0x10;
          local_688._8_8_ = (pointer)0x0;
          local_688._16_8_ = local_608;
          aStack_670._M_allocated_capacity = (size_type)&local_6f8;
          aStack_630._8_8_ = aStack_630._8_8_ & 0xffffffffffffff00;
          local_638 = (_Manager_type)0x0;
          aStack_630._M_allocated_capacity = 0;
          auStack_650._8_8_ = 0;
          auStack_650._16_8_ = (_Manager_type)0x0;
          local_658 = (pointer)0x0;
          auStack_650._0_8_ = (char *)0x0;
          aStack_670._8_8_ = (cmExportBuildFileGenerator *)0x0;
          _Stack_660._M_p = (pointer)0x0;
          ArgumentParser::Instance::
          Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    ((Instance *)local_688,
                     (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&local_728,0);
          if (local_638 != (_Manager_type)0x0) {
            (*local_638)((_Any_data *)(auStack_650 + 8),(_Any_data *)(auStack_650 + 8),
                         __destroy_functor);
          }
          if (local_608._0_8_ == local_608._8_8_) {
            pPVar13 = cmExportSet::GetPackageDependencyForSetup
                                (local_618,(string *)pcVar11->_vptr_cmGlobalGenerator);
            if ((_Any_data *)local_6f8._8_8_ != (_Any_data *)0x0) {
              iVar7 = std::__cxx11::string::compare(local_6f8._M_pod_data);
              if (iVar7 == 0) {
                PVar19 = Auto;
              }
              else {
                value_00._M_str = (char *)local_6f8._M_unused._0_8_;
                value_00._M_len = local_6f8._8_8_;
                bVar6 = cmValue::IsOff(value_00);
                PVar19 = Off;
                if (!bVar6) {
                  value._M_str = extraout_RDX;
                  value._M_len = local_6f8._M_unused._0_8_;
                  bVar6 = cmValue::IsOn((cmValue *)local_6f8._8_8_,value);
                  PVar19 = On;
                  if (!bVar6) {
                    local_688._0_8_ = (char *)0x30;
                    local_688._8_8_ = "Invalid enable setting for package dependency: \"";
                    local_688._16_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    aStack_670._0_8_ = local_6f8._8_8_;
                    aStack_670._8_8_ = local_6f8._M_unused._M_object;
                    _Stack_660._M_p = (pointer)0x0;
                    local_658 = (pointer)&DAT_00000001;
                    auStack_650._0_8_ = (long)"\n\t\t\t\"" + 4;
                    auStack_650._8_8_ = 0;
                    views._M_len = 3;
                    views._M_array = (iterator)local_688;
                    cmCatViews((string *)&local_728,views);
                    std::__cxx11::string::_M_assign((string *)local_5d0._16_8_);
                    goto LAB_003b2edc;
                  }
                }
              }
              pPVar13->Enabled = PVar19;
            }
            iVar7 = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &pPVar13->ExtraArguments,
                       (pPVar13->ExtraArguments).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,local_6d8._0_8_,local_6d8._8_8_);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_728,"Unknown argument: \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_608._0_8_);
            plVar12 = (long *)std::__cxx11::string::append(local_728._M_pod_data);
            plVar20 = plVar12 + 2;
            if ((long *)*plVar12 == plVar20) {
              local_688._16_8_ = *plVar20;
              aStack_670._M_allocated_capacity = plVar12[3];
              local_688._0_8_ = local_688 + 0x10;
            }
            else {
              local_688._16_8_ = *plVar20;
              local_688._0_8_ = (long *)*plVar12;
            }
            local_688._8_8_ = plVar12[1];
            *plVar12 = (long)plVar20;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            std::__cxx11::string::_M_assign((string *)local_5d0._16_8_);
            if ((undefined1 *)local_688._0_8_ != local_688 + 0x10) {
              operator_delete((void *)local_688._0_8_,(ulong)(local_688._16_8_ + 1));
            }
LAB_003b2edc:
            if ((_func_int **)local_728._M_unused._0_8_ != &local_718) {
              operator_delete(local_728._M_unused._M_object,(ulong)(local_718 + 1));
            }
            iVar7 = 1;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_6d8);
          if ((cmExportBuildFileGenerator *)local_6f8._M_unused._0_8_ !=
              (cmExportBuildFileGenerator *)local_6e8) {
            operator_delete(local_6f8._M_unused._M_object,
                            (ulong)((long)&(((string *)local_6e8._0_8_)->_M_dataplus)._M_p + 1));
          }
        }
        if ((iVar7 != 3) && (iVar7 != 0)) {
          bVar6 = false;
          goto LAB_003b3789;
        }
        pcVar11 = (cmGlobalGenerator *)&(pcVar11->MakeSilentFlag)._M_string_length;
      } while (pcVar11 != local_700);
    }
    auStack_6a0._8_8_ = (pointer)0x0;
    auStack_6a0._16_8_ = 0;
    local_6a8 = (pointer)0x0;
    auStack_6a0._0_8_ = (pointer)0x0;
    local_6b8 = (pointer)0x0;
    pbStack_6b0 = (pointer)0x0;
    local_6d8._16_8_ = 0;
    _Stack_6c0._M_p = (pointer)0x0;
    local_6d8._0_8_ = (pointer)0x0;
    local_6d8._8_8_ = (code *)0x0;
    local_6e8._0_8_ = (pointer)0x0;
    local_6e8._8_8_ = (_Any_data *)0x0;
    local_6f8._M_unused._M_object = (cmExportBuildFileGenerator *)0x0;
    local_6f8._8_8_ = (_Any_data *)0x0;
    local_728._M_unused._M_object = (_func_int **)0x0;
    local_728._8_8_ = 0.0;
    pcStack_710 = std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                  ::_M_invoke;
    local_718 = std::
                _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                ::_M_manager;
    name_13._M_str = "XCFRAMEWORK_LOCATION";
    name_13._M_len = 0x14;
    ArgumentParser::Base::Bind((Base *)&local_6f8,name_13,(KeywordAction *)&local_728);
    if (local_718 != (_func_int *)0x0) {
      (*local_718)(&local_728,&local_728,3);
    }
    ArgumentParser::ActionMap::ActionMap((ActionMap *)local_688,(ActionMap *)&local_6f8);
    std::
    vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
               *)auStack_6a0);
    if (pbStack_6b0 != (pointer)0x0) {
      (*(code *)pbStack_6b0)(&_Stack_6c0,&_Stack_6c0,3);
    }
    if ((code *)local_6d8._8_8_ != (code *)0x0) {
      (*(code *)local_6d8._8_8_)(local_6e8 + 8,local_6e8 + 8,3);
    }
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               *)&local_6f8);
    local_700 = (cmGlobalGenerator *)aaStack_170[0]._0_8_;
    bVar6 = local_178 == (cmGlobalGenerator *)aaStack_170[0]._0_8_;
    if (!bVar6) {
      local_730 = (cmExecutionStatus *)&local_730->Error;
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_608 + 0x28);
      pcVar11 = local_178;
      do {
        if (pcVar11->_vptr_cmGlobalGenerator == (_func_int **)(pcVar11->TryCompileTimeout).__r) {
          iVar7 = 5;
        }
        else {
          local_5d8 = (undefined1  [8])(pcVar11->TryCompileTimeout).__r;
          local_608._40_8_ = pcVar11->_vptr_cmGlobalGenerator + 4;
          local_728._M_unused._M_object = &local_718;
          local_728._8_8_ = 0.0;
          local_718 = (_func_int *)((ulong)local_718 & 0xffffffffffffff00);
          local_6f8._M_unused._M_object = local_688;
          local_6f8._8_8_ = (_Any_data *)0x0;
          local_6e8._0_8_ = local_608;
          local_6e8._8_8_ = &local_728;
          auStack_6a0._8_8_ = auStack_6a0._8_8_ & 0xffffffffffffff00;
          local_6a8 = (pointer)0x0;
          auStack_6a0._0_8_ = (pointer)0x0;
          local_6b8 = (pointer)0x0;
          pbStack_6b0 = (pointer)0x0;
          local_6d8._16_8_ = 0;
          _Stack_6c0._M_p = (pointer)0x0;
          local_6d8._0_8_ = (pointer)0x0;
          local_6d8._8_8_ = (code *)0x0;
          ArgumentParser::Instance::
          Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                    ((Instance *)&local_6f8,
                     (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)__return_storage_ptr__,0);
          if (local_6a8 != (pointer)0x0) {
            (*(code *)local_6a8)(&local_6b8,&local_6b8,3);
          }
          pcVar4 = local_730;
          if (local_608._0_8_ == local_608._8_8_) {
            iVar7 = 0;
            cmExportSet::SetXcFrameworkLocation
                      (local_618,(string *)pcVar11->_vptr_cmGlobalGenerator,(string *)&local_728);
          }
          else {
            std::operator+(__return_storage_ptr__,"Unknown argument: \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_608._0_8_);
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)__return_storage_ptr__);
            local_6f8._M_unused._M_object = local_6e8;
            pcVar16 = (cmExportBuildFileGenerator *)(puVar10 + 2);
            if ((cmExportBuildFileGenerator *)*puVar10 == pcVar16) {
              local_6e8._0_8_ =
                   (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                      *)&(pcVar16->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
                   super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
              local_6e8._8_8_ = puVar10[3];
            }
            else {
              local_6e8._0_8_ =
                   (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                      *)&(pcVar16->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
                   super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
              local_6f8._M_unused._M_object = (cmExportBuildFileGenerator *)*puVar10;
            }
            local_6f8._8_8_ = puVar10[1];
            *puVar10 = pcVar16;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_assign((string *)pcVar4);
            if ((cmExportBuildFileGenerator *)local_6f8._M_unused._0_8_ !=
                (cmExportBuildFileGenerator *)local_6e8) {
              operator_delete(local_6f8._M_unused._M_object,
                              (ulong)((long)&(((string *)local_6e8._0_8_)->_M_dataplus)._M_p + 1));
            }
            if ((pointer)local_608._40_8_ != (pointer)(local_5d8 + 8)) {
              operator_delete((void *)local_608._40_8_,local_5d0._0_8_ + 1);
            }
            iVar7 = 1;
          }
          if ((_func_int **)local_728._M_unused._0_8_ != &local_718) {
            operator_delete(local_728._M_unused._M_object,(ulong)(local_718 + 1));
          }
        }
        if ((iVar7 != 5) && (iVar7 != 0)) break;
        pcVar11 = (cmGlobalGenerator *)&(pcVar11->MakeSilentFlag)._M_string_length;
        bVar6 = pcVar11 == local_700;
      } while (!bVar6);
    }
    std::
    vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
               *)&aStack_630);
    if ((_Manager_type)auStack_650._16_8_ != (_Manager_type)0x0) {
      (*(code *)auStack_650._16_8_)(auStack_650,auStack_650,3);
    }
    if ((_Manager_type)_Stack_660._M_p != (_Manager_type)0x0) {
      (*(code *)_Stack_660._M_p)(&aStack_670,&aStack_670,3);
    }
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               *)local_688);
LAB_003b3789:
    std::
    vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
               *)&aStack_540);
    if ((pointer)_Stack_550._M_p != (pointer)0x0) {
      (*(code *)_Stack_550._M_p)(local_588 + 0x28,local_588 + 0x28,3);
    }
    if ((code *)local_588._24_8_ != (code *)0x0) {
      (*(code *)local_588._24_8_)(local_588 + 8,local_588 + 8,3);
    }
    std::
    vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
               *)(local_5a8 + 0x10));
    goto LAB_003b28e5;
  }
  local_688._0_8_ = local_688 + 0x10;
  local_688._8_8_ = (pointer)0x0;
  local_688._16_8_ = local_688._16_8_ & 0xffffffffffffff00;
  local_618 = local_1d8;
  if (local_1d8 != (cmExportSet *)0x0) {
    std::__cxx11::string::_M_assign((string *)local_688);
  }
  if ((pointer)local_688._8_8_ == (pointer)0x0 && local_200._M_string_length == 0) {
    iVar7 = std::__cxx11::string::compare
                      ((char *)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    if (iVar7 == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_5a8 + 0x10),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_260
                     ,".cmake");
      std::__cxx11::string::operator=((string *)local_688,(string *)(local_5a8 + 0x10));
      if (local_598 != (undefined1  [8])local_588) {
        operator_delete((void *)local_598,
                        (ulong)((long)&(((string *)local_588._0_8_)->_M_dataplus)._M_p + 1));
      }
      goto LAB_003b37fa;
    }
    local_598 = (undefined1  [8])local_588;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_5a8 + 0x10),"FILE <filename> option missing.","");
    std::__cxx11::string::_M_assign((string *)&local_730->Error);
    if (local_598 != (undefined1  [8])local_588) {
      operator_delete((void *)local_598,
                      (ulong)((long)&(((string *)local_588._0_8_)->_M_dataplus)._M_p + 1));
    }
LAB_003b38e7:
    bVar6 = false;
  }
  else {
    if ((pointer)local_688._8_8_ == (pointer)0x0) {
      cmsys::SystemTools::GetFilenameLastExtension((string *)(local_5a8 + 0x10),&local_200);
      iVar7 = std::__cxx11::string::compare(local_5a8 + 0x10);
      if (local_598 != (undefined1  [8])local_588) {
        operator_delete((void *)local_598,
                        (ulong)((long)&(((string *)local_588._0_8_)->_M_dataplus)._M_p + 1));
      }
      if (iVar7 == 0) {
        std::__cxx11::string::_M_assign((string *)local_688);
        goto LAB_003b37fa;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_5a8 + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_5a8 + 0x10),"FILE option given filename \"",0x1c);
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_5a8 + 0x10),local_200._M_dataplus._M_p,
                           local_200._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"\" which does not have an extension of \".cmake\".\n",0x30);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&local_730->Error);
LAB_003b38ab:
      if ((cmExportBuildFileGenerator *)local_6f8._M_unused._0_8_ !=
          (cmExportBuildFileGenerator *)local_6e8) {
        operator_delete(local_6f8._M_unused._M_object,
                        (ulong)((long)&(((string *)local_6e8._0_8_)->_M_dataplus)._M_p + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_5a8 + 0x10));
      std::ios_base::~ios_base((ios_base *)(auStack_530 + 8));
      goto LAB_003b38e7;
    }
LAB_003b37fa:
    pcVar2 = local_730->Makefile;
    bVar6 = cmsys::SystemTools::FileIsFullPath((string *)local_688);
    if (bVar6) {
      bVar6 = cmMakefile::CanIWriteThisFile(pcVar2,(string *)local_688);
      if (!bVar6) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_5a8 + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_5a8 + 0x10),"FILE option given filename \"",0x1c);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_5a8 + 0x10),(char *)local_688._0_8_,local_688._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"\" which is in the source tree.\n",0x1f);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_assign((string *)&local_730->Error);
        goto LAB_003b38ab;
      }
    }
    else {
      psVar15 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(pcVar2);
      pcVar3 = (psVar15->_M_dataplus)._M_p;
      local_6f8._M_unused._M_object = (cmExportBuildFileGenerator *)local_6e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_6f8,pcVar3,pcVar3 + psVar15->_M_string_length);
      std::__cxx11::string::append(local_6f8._M_pod_data);
      puVar10 = (undefined8 *)std::__cxx11::string::_M_append(local_6f8._M_pod_data,local_688._0_8_)
      ;
      pcVar16 = (cmExportBuildFileGenerator *)(puVar10 + 2);
      if ((cmExportBuildFileGenerator *)*puVar10 == pcVar16) {
        local_588._0_8_ =
             (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                *)&(pcVar16->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
             super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_588._8_8_ = puVar10[3];
        local_598 = (undefined1  [8])local_588;
      }
      else {
        local_588._0_8_ =
             (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                *)&(pcVar16->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
             super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        local_598 = (undefined1  [8])*puVar10;
      }
      pcStack_590 = (cmExportBuildFileGenerator *)puVar10[1];
      *puVar10 = pcVar16;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_688,(string *)(local_5a8 + 0x10));
      if (local_598 != (undefined1  [8])local_588) {
        operator_delete((void *)local_598,
                        (ulong)((long)&(((string *)local_588._0_8_)->_M_dataplus)._M_p + 1));
      }
      if ((cmExportBuildFileGenerator *)local_6f8._M_unused._0_8_ !=
          (cmExportBuildFileGenerator *)local_6e8) {
        operator_delete(local_6f8._M_unused._M_object,
                        (ulong)((long)&(((string *)local_6e8._0_8_)->_M_dataplus)._M_p + 1));
      }
    }
    local_728._M_unused._M_object = (_func_int **)0x0;
    local_728._8_8_ = 0.0;
    local_718 = (_func_int *)0x0;
    local_700 = cmMakefile::GetGlobalGenerator(pcVar2);
    iVar7 = std::__cxx11::string::compare
                      ((char *)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start);
    pcVar11 = local_700;
    if (iVar7 == 0) {
      iVar17 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
                       *)&local_700->ExportSets,(key_type *)&local_260);
      p_Var25 = &(pcVar11->ExportSets).
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
                 ._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)iVar17._M_node == p_Var25) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_5a8 + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_5a8 + 0x10),"Export set \"",0xc);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)(local_5a8 + 0x10),(char *)local_260._M_allocated_capacity,
                             local_260._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\" not found.",0xc);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_assign((string *)&local_730->Error);
        if ((cmExportBuildFileGenerator *)local_6f8._M_unused._0_8_ !=
            (cmExportBuildFileGenerator *)local_6e8) {
          operator_delete(local_6f8._M_unused._M_object,
                          (ulong)((long)&(((string *)local_6e8._0_8_)->_M_dataplus)._M_p + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_5a8 + 0x10));
        std::ios_base::~ios_base((ios_base *)(auStack_530 + 8));
        exportSet = (cmExportSet *)0x0;
      }
      else {
        exportSet = (cmExportSet *)(iVar17._M_node + 2);
      }
      if ((_Rb_tree_header *)iVar17._M_node == p_Var25) goto LAB_003b4089;
LAB_003b3c83:
      pcVar16 = cmGlobalGenerator::GetExportedTargetsFile(local_700,(string *)local_688);
      if ((pcVar16 != (cmExportBuildFileGenerator *)0x0) &&
         (PVar9 = cmMakefile::GetPolicyStatus(pcVar2,CMP0103,false), PVar9 != OLD)) {
        if (PVar9 != WARN) {
          cmStrCat<char_const(&)[42],std::__cxx11::string_const&,char_const(&)[32]>
                    ((string *)(local_5a8 + 0x10),(char (*) [42])0x8c30d7,&local_200,
                     (char (*) [32])"\nDid you miss \'APPEND\' keyword?");
          std::__cxx11::string::_M_assign((string *)&local_730->Error);
          pTVar23 = (pointer)local_588._0_8_;
          uVar24 = local_598;
          if (local_598 != (undefined1  [8])local_588) goto LAB_003b3bae;
          goto LAB_003b4089;
        }
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&local_6f8,(cmPolicies *)0x67,id);
        local_608[0x28] = 10;
        cmStrCat<std::__cxx11::string,char,char_const(&)[51],std::__cxx11::string_const&,char_const(&)[32]>
                  ((string *)(local_5a8 + 0x10),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_6f8,
                   local_608 + 0x28,
                   (char (*) [51])"export() command already specified for the file\n  ",&local_200,
                   (char (*) [32])"\nDid you miss \'APPEND\' keyword?");
        cmMakefile::IssueMessage(pcVar2,AUTHOR_WARNING,(string *)(local_5a8 + 0x10));
        if (local_598 != (undefined1  [8])local_588) {
          operator_delete((void *)local_598,
                          (ulong)((long)&(((string *)local_588._0_8_)->_M_dataplus)._M_p + 1));
        }
        if ((cmExportBuildFileGenerator *)local_6f8._M_unused._0_8_ !=
            (cmExportBuildFileGenerator *)local_6e8) {
          operator_delete(local_6f8._M_unused._M_object,
                          (ulong)((long)&(((string *)local_6e8._0_8_)->_M_dataplus)._M_p + 1));
        }
      }
      if (local_618 == (cmExportSet *)0x0) {
        std::make_unique<cmExportBuildFileGenerator>();
      }
      else {
        std::make_unique<cmExportBuildAndroidMKGenerator>();
      }
      this = local_598;
      cmExportFileGenerator::SetExportFile
                ((cmExportFileGenerator *)local_598,(char *)local_688._0_8_);
      std::__cxx11::string::_M_assign((string *)&((cmExportFileGenerator *)this)->Namespace);
      local_280._M_allocated_capacity = (size_type)local_270;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_280,local_1c0,
                 (long)&(local_1b8->Name)._M_dataplus._M_p + (long)local_1c0);
      std::__cxx11::string::operator=
                ((string *)((long)this + 0x198),(string *)local_280._M_local_buf);
      if ((_Alloc_hider *)local_280._M_allocated_capacity != local_270) {
        operator_delete((void *)local_280._M_allocated_capacity,(ulong)(local_270[0]._M_p + 1));
      }
      ((cmExportFileGenerator *)this)->AppendMode = (bool)(char)local_1a0;
      if (exportSet == (cmExportSet *)0x0) {
        std::
        vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
        ::operator=((vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                     *)((long)this + 0x158),
                    (vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                     *)&local_728);
      }
      else {
        cmExportBuildFileGenerator::SetExportSet((cmExportBuildFileGenerator *)this,exportSet);
      }
      ((cmExportFileGenerator *)this)->ExportOld = local_1a0._1_1_;
      ((cmExportFileGenerator *)this)->ExportPackageDependencies = uStack_187._7_1_;
      cmMakefile::GetGeneratorConfigs_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_5a8 + 0x10),pcVar2,IncludeEmptyConfig);
      pcVar16 = pcStack_590;
      for (config = local_598; config != (undefined1  [8])pcVar16;
          config = (undefined1  [8])
                   ((long)&(((cmExportBuildFileGenerator *)config)->super_cmExportFileGenerator).
                           Namespace.field_2 + 8)) {
        cmExportFileGenerator::AddConfiguration((cmExportFileGenerator *)this,(string *)config);
      }
      if (exportSet == (cmExportSet *)0x0) {
        cmGlobalGenerator::AddBuildExportSet(local_700,(cmExportBuildFileGenerator *)this);
      }
      else {
        cmGlobalGenerator::AddBuildExportExportSet(local_700,(cmExportBuildFileGenerator *)this);
      }
      local_610 = this;
      cmMakefile::AddExportBuildFileGenerator
                (pcVar2,(unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                         *)local_610);
      if (local_610 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_610 + 8))();
      }
      local_610 = (undefined1  [8])0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_5a8 + 0x10));
      bVar6 = true;
    }
    else if (local_228 == '\x01') {
      if (local_240 != local_238) {
        name = local_240;
        do {
          bVar6 = cmMakefile::IsAlias(pcVar2,(string *)name);
          if (bVar6) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_5a8 + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_5a8 + 0x10),"given ALIAS target \"",0x14);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)(local_5a8 + 0x10),*(char **)name,(long)name->_M_parent)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,"\" which may not be exported.",0x1c);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::_M_assign((string *)&local_730->Error);
LAB_003b404d:
            if ((cmExportBuildFileGenerator *)local_6f8._M_unused._0_8_ !=
                (cmExportBuildFileGenerator *)local_6e8) {
              operator_delete(local_6f8._M_unused._M_object,
                              (ulong)((long)&(((string *)local_6e8._0_8_)->_M_dataplus)._M_p + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_5a8 + 0x10));
            std::ios_base::~ios_base((ios_base *)(auStack_530 + 8));
            goto LAB_003b4089;
          }
          this_00 = cmGlobalGenerator::FindTarget(local_700,(string *)name,false);
          if (this_00 == (cmTarget *)0x0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_5a8 + 0x10));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_5a8 + 0x10),"given target \"",0xe);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)(local_5a8 + 0x10),*(char **)name,(long)name->_M_parent)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,"\" which is not built by this project.",0x25);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::_M_assign((string *)&local_730->Error);
            goto LAB_003b404d;
          }
          TVar8 = cmTarget::GetType(this_00);
          if (TVar8 == UTILITY) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_6f8,"given custom target \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name
                          );
            puVar10 = (undefined8 *)std::__cxx11::string::append(local_6f8._M_pod_data);
            pcVar16 = (cmExportBuildFileGenerator *)(puVar10 + 2);
            if ((cmExportBuildFileGenerator *)*puVar10 == pcVar16) {
              local_588._0_8_ =
                   (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                      *)&(pcVar16->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
                   super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
              local_588._8_8_ = puVar10[3];
              local_598 = (undefined1  [8])local_588;
            }
            else {
              local_588._0_8_ =
                   (((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                      *)&(pcVar16->super_cmExportFileGenerator)._vptr_cmExportFileGenerator)->
                   super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
              local_598 = (undefined1  [8])*puVar10;
            }
            pcStack_590 = (cmExportBuildFileGenerator *)puVar10[1];
            *puVar10 = pcVar16;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_assign((string *)&local_730->Error);
            if (local_598 != (undefined1  [8])local_588) {
              operator_delete((void *)local_598,
                              (ulong)((long)&(((string *)local_588._0_8_)->_M_dataplus)._M_p + 1));
            }
            pTVar23 = (pointer)local_6e8._0_8_;
            uVar24 = local_6f8._M_unused._0_8_;
            if ((cmExportBuildFileGenerator *)local_6f8._M_unused._0_8_ ==
                (cmExportBuildFileGenerator *)local_6e8) goto LAB_003b4089;
            goto LAB_003b3bae;
          }
          pcStack_590 = (cmExportBuildFileGenerator *)0x0;
          local_588._0_8_ = local_588._0_8_ & 0xffffffffffffff00;
          local_598 = (undefined1  [8])local_588;
          std::
          vector<cmExportBuildFileGenerator::TargetExport,std::allocator<cmExportBuildFileGenerator::TargetExport>>
          ::emplace_back<std::__cxx11::string_const&,std::__cxx11::string>
                    ((vector<cmExportBuildFileGenerator::TargetExport,std::allocator<cmExportBuildFileGenerator::TargetExport>>
                      *)local_728._M_pod_data,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_5a8 + 0x10));
          if (local_598 != (undefined1  [8])local_588) {
            operator_delete((void *)local_598,
                            (ulong)((long)&(((string *)local_588._0_8_)->_M_dataplus)._M_p + 1));
          }
          name = name + 1;
        } while (name != local_238);
      }
      if (((char)local_1a0 != '\x01') ||
         (pcVar16 = cmGlobalGenerator::GetExportedTargetsFile(local_700,(string *)local_688),
         pcVar16 == (cmExportBuildFileGenerator *)0x0)) {
        exportSet = (cmExportSet *)0x0;
        goto LAB_003b3c83;
      }
      bVar6 = true;
      std::
      vector<cmExportBuildFileGenerator::TargetExport,std::allocator<cmExportBuildFileGenerator::TargetExport>>
      ::
      _M_range_insert<__gnu_cxx::__normal_iterator<cmExportBuildFileGenerator::TargetExport_const*,std::vector<cmExportBuildFileGenerator::TargetExport,std::allocator<cmExportBuildFileGenerator::TargetExport>>>>
                ((vector<cmExportBuildFileGenerator::TargetExport,std::allocator<cmExportBuildFileGenerator::TargetExport>>
                  *)&pcVar16->Targets,
                 (pcVar16->Targets).
                 super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                 ._M_impl.super__Vector_impl_data._M_finish,local_728._M_unused._M_object,
                 local_728._8_8_);
    }
    else {
      local_598 = (undefined1  [8])local_588;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_5a8 + 0x10),"EXPORT or TARGETS specifier missing.","");
      std::__cxx11::string::_M_assign((string *)&local_730->Error);
      pTVar23 = (pointer)local_588._0_8_;
      uVar24 = local_598;
      if (local_598 != (undefined1  [8])local_588) {
LAB_003b3bae:
        operator_delete((void *)uVar24,(ulong)((long)&(pTVar23->Name)._M_dataplus._M_p + 1));
      }
LAB_003b4089:
      bVar6 = false;
    }
    std::
    vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ::~vector((vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
               *)&local_728);
  }
  if ((undefined1 *)local_688._0_8_ != local_688 + 0x10) {
    operator_delete((void *)local_688._0_8_,(ulong)(local_688._16_8_ + 1));
  }
LAB_003b28e5:
  cmExportCommand::Arguments::~Arguments((Arguments *)&local_260);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_608);
  std::
  vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  ::~vector((vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
             *)&local_2c0);
  if ((code *)local_2d0._M_p != (code *)0x0) {
    (*(code *)local_2d0._M_p)(&local_2e0,&local_2e0,3);
  }
  if (local_2f0 != (_Manager_type)0x0) {
    (*local_2f0)((_Any_data *)&local_300,(_Any_data *)&local_300,__destroy_functor);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
  ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
             *)local_318);
  return bVar6;
}

Assistant:

bool cmExportCommand(std::vector<std::string> const& args,
                     cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with too few arguments");
    return false;
  }

  if (args[0] == "PACKAGE") {
    return HandlePackage(args, status);
  }

  struct Arguments
  {
    std::string ExportSetName;
    cm::optional<ArgumentParser::MaybeEmpty<std::vector<std::string>>> Targets;
    std::string Namespace;
    std::string Filename;
    std::string AndroidMKFile;
    std::string CxxModulesDirectory;
    bool Append = false;
    bool ExportOld = false;

    std::vector<std::vector<std::string>> PackageDependencyArgs;
    bool ExportPackageDependencies = false;

    std::vector<std::vector<std::string>> TargetArgs;
  };

  auto parser =
    cmArgumentParser<Arguments>{}
      .Bind("NAMESPACE"_s, &Arguments::Namespace)
      .Bind("FILE"_s, &Arguments::Filename)
      .Bind("CXX_MODULES_DIRECTORY"_s, &Arguments::CxxModulesDirectory);

  if (args[0] == "EXPORT") {
    parser.Bind("EXPORT"_s, &Arguments::ExportSetName);
    if (cmExperimental::HasSupportEnabled(
          status.GetMakefile(),
          cmExperimental::Feature::ExportPackageDependencies)) {
      parser.Bind("EXPORT_PACKAGE_DEPENDENCIES"_s,
                  &Arguments::ExportPackageDependencies);
    }
  } else if (args[0] == "SETUP") {
    parser.Bind("SETUP"_s, &Arguments::ExportSetName);
    if (cmExperimental::HasSupportEnabled(
          status.GetMakefile(),
          cmExperimental::Feature::ExportPackageDependencies)) {
      parser.Bind("PACKAGE_DEPENDENCY"_s, &Arguments::PackageDependencyArgs);
    }
    parser.Bind("TARGET"_s, &Arguments::TargetArgs);
  } else {
    parser.Bind("TARGETS"_s, &Arguments::Targets);
    parser.Bind("ANDROID_MK"_s, &Arguments::AndroidMKFile);
    parser.Bind("APPEND"_s, &Arguments::Append);
    parser.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, &Arguments::ExportOld);
  }

  std::vector<std::string> unknownArgs;
  Arguments const arguments = parser.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    status.SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
    return false;
  }

  if (args[0] == "SETUP") {
    cmMakefile& mf = status.GetMakefile();
    cmGlobalGenerator* gg = mf.GetGlobalGenerator();

    cmExportSetMap& setMap = gg->GetExportSets();
    auto& exportSet = setMap[arguments.ExportSetName];

    struct PackageDependencyArguments
    {
      std::string Enabled;
      ArgumentParser::MaybeEmpty<std::vector<std::string>> ExtraArgs;
    };

    auto packageDependencyParser =
      cmArgumentParser<PackageDependencyArguments>{}
        .Bind("ENABLED"_s, &PackageDependencyArguments::Enabled)
        .Bind("EXTRA_ARGS"_s, &PackageDependencyArguments::ExtraArgs);

    for (auto const& packageDependencyArgs : arguments.PackageDependencyArgs) {
      if (packageDependencyArgs.empty()) {
        continue;
      }

      PackageDependencyArguments const packageDependencyArguments =
        packageDependencyParser.Parse(
          cmMakeRange(packageDependencyArgs).advance(1), &unknownArgs);

      if (!unknownArgs.empty()) {
        status.SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
        return false;
      }

      auto& packageDependency =
        exportSet.GetPackageDependencyForSetup(packageDependencyArgs.front());

      if (!packageDependencyArguments.Enabled.empty()) {
        if (packageDependencyArguments.Enabled == "AUTO") {
          packageDependency.Enabled =
            cmExportSet::PackageDependencyExportEnabled::Auto;
        } else if (cmIsOff(packageDependencyArguments.Enabled)) {
          packageDependency.Enabled =
            cmExportSet::PackageDependencyExportEnabled::Off;
        } else if (cmIsOn(packageDependencyArguments.Enabled)) {
          packageDependency.Enabled =
            cmExportSet::PackageDependencyExportEnabled::On;
        } else {
          status.SetError(
            cmStrCat("Invalid enable setting for package dependency: \"",
                     packageDependencyArguments.Enabled, "\""));
          return false;
        }
      }

      cm::append(packageDependency.ExtraArguments,
                 packageDependencyArguments.ExtraArgs);
    }

    struct TargetArguments
    {
      std::string XcFrameworkLocation;
    };

    auto targetParser = cmArgumentParser<TargetArguments>{}.Bind(
      "XCFRAMEWORK_LOCATION"_s, &TargetArguments::XcFrameworkLocation);

    for (auto const& targetArgs : arguments.TargetArgs) {
      if (targetArgs.empty()) {
        continue;
      }

      TargetArguments const targetArguments =
        targetParser.Parse(cmMakeRange(targetArgs).advance(1), &unknownArgs);

      if (!unknownArgs.empty()) {
        status.SetError("Unknown argument: \"" + unknownArgs.front() + "\".");
        return false;
      }

      exportSet.SetXcFrameworkLocation(targetArgs.front(),
                                       targetArguments.XcFrameworkLocation);
    }

    return true;
  }

  std::string fname;
  bool android = false;
  if (!arguments.AndroidMKFile.empty()) {
    fname = arguments.AndroidMKFile;
    android = true;
  }
  if (arguments.Filename.empty() && fname.empty()) {
    if (args[0] != "EXPORT") {
      status.SetError("FILE <filename> option missing.");
      return false;
    }
    fname = arguments.ExportSetName + ".cmake";
  } else if (fname.empty()) {
    // Make sure the file has a .cmake extension.
    if (cmSystemTools::GetFilenameLastExtension(arguments.Filename) !=
        ".cmake") {
      std::ostringstream e;
      e << "FILE option given filename \"" << arguments.Filename
        << "\" which does not have an extension of \".cmake\".\n";
      status.SetError(e.str());
      return false;
    }
    fname = arguments.Filename;
  }

  cmMakefile& mf = status.GetMakefile();

  // Get the file to write.
  if (cmSystemTools::FileIsFullPath(fname)) {
    if (!mf.CanIWriteThisFile(fname)) {
      std::ostringstream e;
      e << "FILE option given filename \"" << fname
        << "\" which is in the source tree.\n";
      status.SetError(e.str());
      return false;
    }
  } else {
    // Interpret relative paths with respect to the current build dir.
    std::string const& dir = mf.GetCurrentBinaryDirectory();
    fname = dir + "/" + fname;
  }

  std::vector<cmExportBuildFileGenerator::TargetExport> targets;

  cmGlobalGenerator* gg = mf.GetGlobalGenerator();

  cmExportSet* exportSet = nullptr;
  if (args[0] == "EXPORT") {
    cmExportSetMap& setMap = gg->GetExportSets();
    auto const it = setMap.find(arguments.ExportSetName);
    if (it == setMap.end()) {
      std::ostringstream e;
      e << "Export set \"" << arguments.ExportSetName << "\" not found.";
      status.SetError(e.str());
      return false;
    }
    exportSet = &it->second;
  } else if (arguments.Targets) {
    for (std::string const& currentTarget : *arguments.Targets) {
      if (mf.IsAlias(currentTarget)) {
        std::ostringstream e;
        e << "given ALIAS target \"" << currentTarget
          << "\" which may not be exported.";
        status.SetError(e.str());
        return false;
      }

      if (cmTarget* target = gg->FindTarget(currentTarget)) {
        if (target->GetType() == cmStateEnums::UTILITY) {
          status.SetError("given custom target \"" + currentTarget +
                          "\" which may not be exported.");
          return false;
        }
      } else {
        std::ostringstream e;
        e << "given target \"" << currentTarget
          << "\" which is not built by this project.";
        status.SetError(e.str());
        return false;
      }
      targets.emplace_back(currentTarget, std::string{});
    }
    if (arguments.Append) {
      if (cmExportBuildFileGenerator* ebfg =
            gg->GetExportedTargetsFile(fname)) {
        ebfg->AppendTargets(targets);
        return true;
      }
    }
  } else {
    status.SetError("EXPORT or TARGETS specifier missing.");
    return false;
  }

  // if cmExportBuildFileGenerator is already defined for the file
  // and APPEND is not specified, if CMP0103 is OLD ignore previous definition
  // else raise an error
  if (gg->GetExportedTargetsFile(fname) != nullptr) {
    switch (mf.GetPolicyStatus(cmPolicies::CMP0103)) {
      case cmPolicies::WARN:
        mf.IssueMessage(
          MessageType::AUTHOR_WARNING,
          cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0103), '\n',
                   "export() command already specified for the file\n  ",
                   arguments.Filename, "\nDid you miss 'APPEND' keyword?"));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      default:
        status.SetError(cmStrCat("command already specified for the file\n  ",
                                 arguments.Filename,
                                 "\nDid you miss 'APPEND' keyword?"));
        return false;
    }
  }

  // Setup export file generation.
  std::unique_ptr<cmExportBuildFileGenerator> ebfg = nullptr;
  if (android) {
    ebfg = cm::make_unique<cmExportBuildAndroidMKGenerator>();
  } else {
    ebfg = cm::make_unique<cmExportBuildFileGenerator>();
  }
  ebfg->SetExportFile(fname.c_str());
  ebfg->SetNamespace(arguments.Namespace);
  ebfg->SetCxxModuleDirectory(arguments.CxxModulesDirectory);
  ebfg->SetAppendMode(arguments.Append);
  if (exportSet != nullptr) {
    ebfg->SetExportSet(exportSet);
  } else {
    ebfg->SetTargets(targets);
  }
  ebfg->SetExportOld(arguments.ExportOld);
  ebfg->SetExportPackageDependencies(arguments.ExportPackageDependencies);

  // Compute the set of configurations exported.
  std::vector<std::string> configurationTypes =
    mf.GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  for (std::string const& ct : configurationTypes) {
    ebfg->AddConfiguration(ct);
  }
  if (exportSet != nullptr) {
    gg->AddBuildExportExportSet(ebfg.get());
  } else {
    gg->AddBuildExportSet(ebfg.get());
  }
  mf.AddExportBuildFileGenerator(std::move(ebfg));

  return true;
}